

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-graph.hxx
# Opt level: O0

bool __thiscall
lineage::ProblemGraph::
SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::edge
          (SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *this,size_t i)

{
  const_reference pvVar1;
  const_reference pvVar2;
  size_type in_RSI;
  long *in_RDI;
  int t;
  bool local_1;
  
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI[1],in_RSI);
  if (*pvVar1 == '\0') {
    pvVar2 = std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::operator[]
                       ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)(*in_RDI + 0x18),
                        in_RSI);
    if (((long)pvVar2->t0 == in_RDI[2]) || ((long)pvVar2->t0 == in_RDI[2] + 1)) {
      pvVar2 = std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::operator[]
                         ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)(*in_RDI + 0x18),
                          in_RSI);
      if (((long)pvVar2->t1 == in_RDI[2]) || ((long)pvVar2->t1 == in_RDI[2] + 1)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool edge(size_t i) const
        {
            if (edgeLabels_[i] != 0)
                return false;

            auto t = problem_.edges[i].t0;
            if (t != firstFrame_ && t != firstFrame_ + 1)
                return false;

            t = problem_.edges[i].t1;
            if (t != firstFrame_ && t != firstFrame_ + 1)
                return false;

            return true;
        }